

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall
QTreeView::drawRow(QTreeView *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index
                  )

{
  bool bVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  Int IVar13;
  int iVar14;
  int iVar15;
  SelectionBehavior SVar16;
  Int IVar17;
  Int IVar18;
  uint uVar19;
  QTreeViewPrivate *pQVar20;
  QWidget *pQVar21;
  long lVar22;
  qsizetype qVar23;
  const_reference piVar24;
  const_reference pVVar25;
  QItemSelectionModel *pQVar26;
  ulong uVar27;
  QStyle *pQVar28;
  long *plVar29;
  QColor *pQVar30;
  QModelIndex *in_RCX;
  long in_RDX;
  QRect *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QRect QVar31;
  int x;
  ColorGroup cg_1;
  bool oldShowDecorationSelected;
  bool setClipRect;
  int i;
  ColorGroup cg;
  int lastSection;
  int headerSection;
  int currentLogicalSection;
  bool hoverRow;
  int position;
  int height;
  int width;
  int c_2;
  int c_1;
  int r_1;
  bool currentRowHasFocus;
  bool widgetHasFocus;
  QWidget *editor;
  int c;
  QWidget *fw;
  int r;
  bool indexWidgetHasFocus;
  bool allColumnsShowFocus;
  bool enabled;
  bool alternate;
  int right;
  int left;
  bool spanning;
  bool reverse;
  QHeaderView *header;
  int y;
  QTreeViewPrivate *d;
  QRect sectionRect;
  QRect focusRect;
  State oldState_1;
  State oldState;
  QRect branches;
  QList<QStyleOptionViewItem::ViewItemPosition> viewItemPosList;
  QList<int> logicalIndices;
  QModelIndex modelIndex;
  QModelIndex parent_1;
  QModelIndex idx_1;
  QModelIndex idx;
  State state;
  QModelIndex hover;
  QModelIndex current;
  QModelIndex parent;
  QPoint offset;
  QStyleOptionFocusRect o;
  QStyleOptionViewItem opt;
  ColorRole in_stack_fffffffffffffba8;
  ColorGroup in_stack_fffffffffffffbac;
  LayoutDirection in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  int in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  int in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbc4;
  QWidget *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  QHeaderView *in_stack_fffffffffffffbd8;
  LayoutDirection direction;
  undefined8 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  QList<int> *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc24;
  byte local_3d5;
  byte local_3ce;
  byte local_3cd;
  int local_3c4;
  int local_3b0;
  ColorGroup local_3a0;
  int local_394;
  int local_38c;
  int local_384;
  int local_380;
  int local_37c;
  bool local_372;
  int local_364;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_2a8;
  Int local_2a4;
  Int local_2a0;
  undefined1 local_29c [16];
  undefined1 *local_28c;
  undefined1 *local_284;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_27c;
  undefined4 local_278;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_274;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  QList<int> local_240 [3];
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 local_1e0 [24];
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_180;
  Int local_17c;
  QModelIndex local_178;
  undefined1 *local_160;
  undefined1 *local_158;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  QPoint local_130;
  undefined1 local_128 [8];
  QFlags<QStyle::StateFlag> aQStack_120 [2];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_e8;
  undefined4 local_e0;
  ushort local_dc;
  undefined1 local_d8 [8];
  QFlagsStorage<QStyle::StateFlag> local_d0 [2];
  undefined1 *local_c8;
  undefined1 *local_c0;
  QPalette aQStack_b0 [4];
  byte local_70;
  QFlags<QStyleOptionViewItem::ViewItemFeature> aQStack_6c [21];
  ViewItemPosition local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar20 = d_func((QTreeView *)0x8f6e51);
  memset(local_d8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem
            ((QStyleOptionViewItem *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
             (QStyleOptionViewItem *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  local_130 = (pQVar20->super_QAbstractItemViewPrivate).scrollDelayOffset;
  iVar11 = QRect::y((QRect *)0x8f6ebc);
  iVar12 = QPoint::y((QPoint *)0x8f6ed0);
  iVar11 = iVar11 + iVar12;
  local_148 = &DAT_aaaaaaaaaaaaaaaa;
  local_140 = &DAT_aaaaaaaaaaaaaaaa;
  local_138 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent((QModelIndex *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  local_160 = &DAT_aaaaaaaaaaaaaaaa;
  local_158 = &DAT_aaaaaaaaaaaaaaaa;
  local_150.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex
            ((QAbstractItemView *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  local_178._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_178.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_178.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)&local_178);
  bVar4 = QWidget::isRightToLeft((QWidget *)0x8f6fd3);
  local_17c = local_d0[0].i;
  bVar5 = pQVar20->spanning & 1;
  if (bVar5 == 0) {
    iVar12 = (pQVar20->leftAndRight).first;
    local_3c4 = (pQVar20->leftAndRight).second;
  }
  else {
    iVar12 = QHeaderView::visualIndex(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
    local_3c4 = QHeaderView::visualIndex(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
  }
  bVar1 = (pQVar20->super_QAbstractItemViewPrivate).alternatingColors;
  local_180.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                  in_stack_fffffffffffffbac);
  IVar13 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_180);
  bVar6 = pQVar20->allColumnsShowFocus & 1;
  bVar3 = false;
  iVar14 = QModelIndex::row((QModelIndex *)&local_160);
  iVar15 = QModelIndex::row(in_RCX);
  if ((iVar14 == iVar15) &&
     (bVar7 = QHash<QWidget_*,_QPersistentModelIndex>::isEmpty
                        (&(pQVar20->super_QAbstractItemViewPrivate).editorIndexHash), !bVar7)) {
    iVar14 = QModelIndex::row(in_RCX);
    QApplication::focusWidget();
    for (local_364 = 0;
        iVar15 = QHeaderView::count((QHeaderView *)
                                    CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)),
        local_364 < iVar15; local_364 = local_364 + 1) {
      local_198 = &DAT_aaaaaaaaaaaaaaaa;
      local_190 = &DAT_aaaaaaaaaaaaaaaa;
      local_188 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = (pQVar20->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar2 + 0x60))(&local_198,pQVar2,iVar14,local_364,&local_148);
      pQVar21 = QAbstractItemView::indexWidget
                          ((QAbstractItemView *)
                           CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                           (QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      if ((pQVar21 != (QWidget *)0x0) &&
         (bVar7 = ancestorOf((QObject *)
                             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                             (QObject *)
                             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)), bVar7))
      {
        bVar3 = true;
        break;
      }
    }
  }
  bVar7 = QWidget::hasFocus(in_stack_fffffffffffffbc8);
  local_372 = false;
  if (((bVar6 != 0) && (bVar7)) &&
     (bVar8 = QModelIndex::isValid
                        ((QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)), bVar8)) {
    iVar14 = QModelIndex::row(in_RCX);
    local_37c = 0;
    while( true ) {
      local_3cd = 0;
      if (local_37c < iVar12) {
        local_3cd = local_372 ^ 0xff;
      }
      if ((local_3cd & 1) == 0) break;
      local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = (pQVar20->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar2 + 0x60))(&local_1b0,pQVar2,iVar14,local_37c,&local_148);
      local_372 = ::operator==((QModelIndex *)
                               CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                               (QModelIndex *)
                               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      local_37c = local_37c + 1;
    }
    local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (pQVar20->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar2 + 0x68))(&local_1c8,pQVar2,in_RCX);
    local_380 = local_3c4;
    while( true ) {
      iVar12 = QHeaderView::count((QHeaderView *)
                                  CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      local_3ce = 0;
      if (local_380 < iVar12) {
        local_3ce = local_372 ^ 0xff;
      }
      if ((local_3ce & 1) == 0) break;
      pQVar2 = (pQVar20->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar2 + 0x60))(local_1e0,pQVar2,iVar14,local_380,&local_1c8);
      local_372 = ::operator==((QModelIndex *)
                               CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                               (QModelIndex *)
                               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      local_380 = local_380 + 1;
    }
  }
  local_3d5 = 1;
  if (((pQVar20->super_QAbstractItemViewPrivate).selectionBehavior & SelectRows) == SelectItems) {
    local_3d5 = *(byte *)(in_RDX + 0x68);
  }
  local_70 = local_3d5 & 1;
  QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_1f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::QModelIndex((QModelIndex *)0x8f756e);
  SVar16 = QAbstractItemView::selectionBehavior
                     ((QAbstractItemView *)
                      CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  bVar8 = false;
  if (SVar16 == SelectRows) {
    QModelIndex::parent((QModelIndex *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0)
                       );
    QModelIndex::parent((QModelIndex *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0)
                       );
    bVar9 = ::operator==((QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                         (QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    bVar8 = false;
    if (bVar9) {
      in_stack_fffffffffffffc24 = QModelIndex::row(in_RCX);
      iVar12 = QModelIndex::row(&local_178);
      bVar8 = in_stack_fffffffffffffc24 == iVar12;
    }
  }
  local_240[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_240[0].d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_240[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x8f765a);
  local_258 = &DAT_aaaaaaaaaaaaaaaa;
  local_250 = &DAT_aaaaaaaaaaaaaaaa;
  local_248 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QStyleOptionViewItem::ViewItemPosition>::QList
            ((QList<QStyleOptionViewItem::ViewItemPosition> *)0x8f7694);
  QTreeViewPrivate::calcLogicalIndices
            ((QTreeViewPrivate *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             in_stack_fffffffffffffc18,
             (QList<QStyleOptionViewItem::ViewItemPosition> *)
             CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
             (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),(int)in_stack_fffffffffffffc08);
  local_394 = 0;
  while( true ) {
    lVar22 = (long)local_394;
    qVar23 = QList<int>::size(local_240);
    if (qVar23 <= lVar22) break;
    piVar24 = QList<int>::at((QList<int> *)
                             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    iVar12 = *piVar24;
    local_38c = columnViewportPosition
                          ((QTreeView *)
                           CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                           in_stack_fffffffffffffbac);
    iVar14 = QPoint::x((QPoint *)0x8f7739);
    local_38c = local_38c + iVar14;
    local_384 = QHeaderView::sectionSize
                          ((QHeaderView *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc4);
    if (bVar5 != 0) {
      QHeaderView::count((QHeaderView *)
                         CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      QHeaderView::logicalIndex
                ((QHeaderView *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 in_stack_fffffffffffffbb4);
      if (bVar4) {
        iVar14 = columnViewportPosition
                           ((QTreeView *)
                            CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                            in_stack_fffffffffffffbac);
        local_384 = (local_38c - iVar14) + local_384;
        local_38c = columnViewportPosition
                              ((QTreeView *)
                               CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                               in_stack_fffffffffffffbac);
      }
      else {
        iVar14 = columnViewportPosition
                           ((QTreeView *)
                            CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                            in_stack_fffffffffffffbac);
        iVar15 = QHeaderView::sectionSize
                           ((QHeaderView *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc4);
        local_384 = (iVar14 + iVar15) - local_38c;
      }
    }
    pQVar2 = (pQVar20->super_QAbstractItemViewPrivate).model;
    iVar14 = QModelIndex::row(in_RCX);
    (**(code **)(*(long *)pQVar2 + 0x60))(&local_270,pQVar2,iVar14,iVar12,&local_148);
    local_1f8 = local_270;
    local_1f0 = local_268;
    local_1e8 = local_260;
    bVar9 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0))
    ;
    if (bVar9) {
      local_d0[0].i = local_17c;
      pVVar25 = QList<QStyleOptionViewItem::ViewItemPosition>::at
                          ((QList<QStyleOptionViewItem::ViewItemPosition> *)
                           CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                           CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      local_18 = *pVVar25;
      if (bVar3) {
        QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)local_d0,State_Active);
      }
      pQVar26 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8f792c)
      ;
      uVar27 = QItemSelectionModel::isSelected((QModelIndex *)pQVar26);
      if ((uVar27 & 1) != 0) {
        QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)local_d0,State_Selected);
      }
      if ((bVar7) &&
         (bVar9 = ::operator==((QModelIndex *)
                               CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                               (QModelIndex *)
                               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)), bVar9
         )) {
        if (bVar6 == 0) {
          QFlags<QStyle::StateFlag>::operator|=
                    ((QFlags<QStyle::StateFlag> *)local_d0,State_HasFocus);
        }
        else {
          local_372 = true;
        }
      }
      if (!bVar8) {
        ::operator==((QModelIndex *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                     (QModelIndex *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      }
      QFlags<QStyle::StateFlag>::setFlag
                ((QFlags<QStyle::StateFlag> *)
                 CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (StateFlag)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x18,0));
      if (IVar13 != 0) {
        pQVar2 = (pQVar20->super_QAbstractItemViewPrivate).model;
        local_278 = (**(code **)(*(long *)pQVar2 + 0x138))(pQVar2,&local_1f8);
        local_274.super_QFlagsStorage<Qt::ItemFlag>.i =
             (QFlagsStorage<Qt::ItemFlag>)
             QFlags<Qt::ItemFlag>::operator&
                       ((QFlags<Qt::ItemFlag> *)
                        CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                        in_stack_fffffffffffffbac);
        IVar17 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_274);
        if (IVar17 == 0) {
          QFlags<QStyle::StateFlag>::operator&=((QFlags<QStyle::StateFlag> *)local_d0,-2);
          local_3a0 = Disabled;
        }
        else {
          local_27c.super_QFlagsStorage<QStyle::StateFlag>.i =
               (QFlagsStorage<QStyle::StateFlag>)
               QFlags<QStyle::StateFlag>::operator&
                         ((QFlags<QStyle::StateFlag> *)
                          CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                          in_stack_fffffffffffffbac);
          IVar18 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_27c);
          if (IVar18 == 0) {
            local_3a0 = Inactive;
          }
          else {
            local_3a0 = Active;
          }
        }
        QPalette::setCurrentColorGroup(aQStack_b0,local_3a0);
      }
      if ((bVar1 & 1U) != 0) {
        QFlags<QStyleOptionViewItem::ViewItemFeature>::setFlag
                  ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)
                   CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (ViewItemFeature)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x18,0));
      }
      QFlags<QStyleOptionViewItem::ViewItemFeature>::operator&=(aQStack_6c,-0x21);
      bVar9 = QTreeViewPrivate::isTreePosition
                        ((QTreeViewPrivate *)
                         CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                         in_stack_fffffffffffffbac);
      if (bVar9) {
        iVar12 = QTreeViewPrivate::indentationForItem
                           ((QTreeViewPrivate *)
                            CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                            in_stack_fffffffffffffbb4);
        local_28c = &DAT_aaaaaaaaaaaaaaaa;
        local_284 = &DAT_aaaaaaaaaaaaaaaa;
        QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                     in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                     in_stack_fffffffffffffba8);
        iVar14 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                             );
        if (local_384 < iVar14) {
          QPainter::save();
          QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                       in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac
                       ,in_stack_fffffffffffffba8);
          QPainter::setClipRect(in_RSI,(ClipOperation)local_29c);
        }
        bVar10 = local_70 & 1;
        pQVar28 = QWidget::style((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        iVar15 = (**(code **)(*(long *)pQVar28 + 0xf0))(pQVar28,0x3c,local_d8,in_RDI,0);
        local_70 = iVar15 != 0;
        local_c8 = local_28c;
        local_c0 = local_284;
        iVar15 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                             );
        if (0 < iVar15) {
          QFlags<QStyleOptionViewItem::ViewItemFeature>::operator|=
                    (aQStack_6c,IsDecoratedRootColumn);
          QFlags<QStyleOptionViewItem::ViewItemFeature>::operator|=
                    (aQStack_6c,IsDecorationForRootColumn);
          pQVar28 = QWidget::style((QWidget *)
                                   CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
          (**(code **)(*(long *)pQVar28 + 0xb0))(pQVar28,0x2d,local_d8,in_RSI,in_RDI);
          QFlags<QStyleOptionViewItem::ViewItemFeature>::operator&=(aQStack_6c,-0x41);
        }
        local_2a0 = local_d0[0].i;
        QFlags<QStyle::StateFlag>::operator&=((QFlags<QStyle::StateFlag> *)local_d0,-0x8001);
        in_stack_fffffffffffffbd8 = (QHeaderView *)&local_c8;
        in_stack_fffffffffffffbd4 = local_38c;
        if (!bVar4) {
          in_stack_fffffffffffffbd4 = iVar12 + local_38c;
        }
        QRect::setRect((QRect *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc4,
                       in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8
                      );
        pQVar28 = QWidget::style((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        (**(code **)(*(long *)pQVar28 + 0xb0))(pQVar28,0x2d,local_d8,in_RSI,in_RDI);
        local_d0[0].i = local_2a0;
        local_70 = bVar10;
        if (pQVar20->indent != 0) {
          (**(code **)(*in_RDI + 0x308))(in_RDI,in_RSI,&local_28c,in_RCX);
        }
        if (local_384 < iVar14) {
          QPainter::restore();
        }
      }
      else {
        local_2a4 = local_d0[0].i;
        QFlags<QStyle::StateFlag>::operator&=((QFlags<QStyle::StateFlag> *)local_d0,-0x8001);
        QRect::setRect((QRect *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc4,
                       in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8
                      );
        pQVar28 = QWidget::style((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        (**(code **)(*(long *)pQVar28 + 0xb0))(pQVar28,0x2d,local_d8,in_RSI,in_RDI);
        local_d0[0].i = local_2a4;
      }
      plVar29 = (long *)(**(code **)(*in_RDI + 0x208))(in_RDI,&local_1f8);
      (**(code **)(*plVar29 + 0x60))(plVar29,in_RSI,local_d8,&local_1f8);
    }
    local_394 = local_394 + 1;
  }
  local_3b0 = in_stack_fffffffffffffbb4;
  if (local_372 != false) {
    memset(local_128,0xaa,0x50);
    QStyleOptionFocusRect::QStyleOptionFocusRect((QStyleOptionFocusRect *)0x8f8011);
    QStyleOption::operator=
              ((QStyleOption *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               (QStyleOption *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    QFlags<QStyle::StateFlag>::operator|=(aQStack_120,State_KeyboardFocusChange);
    local_2a8.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)
                    CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                    in_stack_fffffffffffffbac);
    IVar13 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2a8);
    uVar19 = (uint)(IVar13 == 0);
    pQVar21 = (QWidget *)(in_RDX + 0x28);
    pQVar26 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8f80ac);
    QItemSelectionModel::isSelected((QModelIndex *)pQVar26);
    pQVar30 = QPalette::color((QPalette *)
                              CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                              in_stack_fffffffffffffbac,in_stack_fffffffffffffba8);
    local_e8 = *(undefined8 *)pQVar30;
    local_e0 = *(undefined4 *)((long)&pQVar30->ct + 4);
    local_dc = (pQVar30->ct).argb.pad;
    local_3b0 = 0;
    if ((*(byte *)(in_RDX + 0x68) & 1) == 0) {
      in_stack_fffffffffffffbc4 =
           QHeaderView::sectionPosition((QHeaderView *)pQVar21,in_stack_fffffffffffffbc4);
      local_3b0 = QTreeViewPrivate::indentationForItem
                            ((QTreeViewPrivate *)
                             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                             in_stack_fffffffffffffbb4);
      local_3b0 = in_stack_fffffffffffffbc4 + local_3b0;
    }
    iVar14 = QHeaderView::offset((QHeaderView *)CONCAT44(local_3b0,in_stack_fffffffffffffbb0));
    iVar14 = local_3b0 - iVar14;
    iVar12 = iVar11;
    QHeaderView::length((QHeaderView *)CONCAT44(local_3b0,in_stack_fffffffffffffbb0));
    QRect::QRect((QRect *)CONCAT44(iVar12,iVar14),local_3b0,in_stack_fffffffffffffbb0,
                 in_stack_fffffffffffffbac,in_stack_fffffffffffffba8);
    QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    QWidget::layoutDirection((QWidget *)0x8f81ed);
    QWidget::rect(pQVar21);
    QVar31 = QStyle::visualRect((LayoutDirection)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                                (QRect *)CONCAT44(in_stack_fffffffffffffbd4,uVar19),(QRect *)pQVar21
                               );
    local_2c8 = QVar31._0_8_;
    local_118 = local_2c8;
    local_2c0 = QVar31._8_8_;
    local_110 = local_2c0;
    pQVar28 = QWidget::style((QWidget *)
                             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    (**(code **)(*(long *)pQVar28 + 0xb0))(pQVar28,3,local_128,in_RSI,0);
    if (((bVar6 != 0) && ((*(byte *)(in_RDX + 0x68) & 1) == 0)) &&
       (bVar4 = QHeaderView::sectionsMoved
                          ((QHeaderView *)CONCAT44(local_3b0,in_stack_fffffffffffffbb0)), bVar4)) {
      iVar15 = QHeaderView::visualIndex(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
      direction = (LayoutDirection)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
      if (iVar15 != 0) {
        QHeaderView::sectionPosition((QHeaderView *)pQVar21,in_stack_fffffffffffffbc4);
        QRect::QRect((QRect *)CONCAT44(iVar12,iVar14),local_3b0,in_stack_fffffffffffffbb0,iVar11,
                     in_stack_fffffffffffffba8);
        QWidget::style((QWidget *)CONCAT44(iVar11,in_stack_fffffffffffffba8));
        in_stack_fffffffffffffbb0 = QWidget::layoutDirection((QWidget *)0x8f834c);
        QWidget::rect(pQVar21);
        QVar31 = QStyle::visualRect(direction,(QRect *)CONCAT44(in_stack_fffffffffffffbd4,uVar19),
                                    (QRect *)pQVar21);
        local_2f8 = QVar31._0_8_;
        local_118 = local_2f8;
        local_2f0 = QVar31._8_8_;
        local_110 = local_2f0;
        pQVar28 = QWidget::style((QWidget *)CONCAT44(iVar11,in_stack_fffffffffffffba8));
        (**(code **)(*(long *)pQVar28 + 0xb0))(pQVar28,3,local_128,in_RSI,0);
      }
    }
    QStyleOptionFocusRect::~QStyleOptionFocusRect((QStyleOptionFocusRect *)0x8f83fb);
  }
  QList<QStyleOptionViewItem::ViewItemPosition>::~QList
            ((QList<QStyleOptionViewItem::ViewItemPosition> *)0x8f8408);
  QList<int>::~QList((QList<int> *)0x8f8415);
  QStyleOptionViewItem::~QStyleOptionViewItem
            ((QStyleOptionViewItem *)CONCAT44(local_3b0,in_stack_fffffffffffffbb0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::drawRow(QPainter *painter, const QStyleOptionViewItem &option,
                        const QModelIndex &index) const
{
    Q_D(const QTreeView);
    QStyleOptionViewItem opt = option;
    const QPoint offset = d->scrollDelayOffset;
    const int y = option.rect.y() + offset.y();
    const QModelIndex parent = index.parent();
    const QHeaderView *header = d->header;
    const QModelIndex current = currentIndex();
    const QModelIndex hover = d->hover;
    const bool reverse = isRightToLeft();
    const QStyle::State state = opt.state;
    const bool spanning = d->spanning;
    const int left = (spanning ? header->visualIndex(0) : d->leftAndRight.first);
    const int right = (spanning ? header->visualIndex(0) : d->leftAndRight.second);
    const bool alternate = d->alternatingColors;
    const bool enabled = (state & QStyle::State_Enabled) != 0;
    const bool allColumnsShowFocus = d->allColumnsShowFocus;


    // when the row contains an index widget which has focus,
    // we want to paint the entire row as active
    bool indexWidgetHasFocus = false;
    if ((current.row() == index.row()) && !d->editorIndexHash.isEmpty()) {
        const int r = index.row();
        QWidget *fw = QApplication::focusWidget();
        for (int c = 0; c < header->count(); ++c) {
            QModelIndex idx = d->model->index(r, c, parent);
            if (QWidget *editor = indexWidget(idx)) {
                if (ancestorOf(editor, fw)) {
                    indexWidgetHasFocus = true;
                    break;
                }
            }
        }
    }

    const bool widgetHasFocus = hasFocus();
    bool currentRowHasFocus = false;
    if (allColumnsShowFocus && widgetHasFocus && current.isValid()) {
        // check if the focus index is before or after the visible columns
        const int r = index.row();
        for (int c = 0; c < left && !currentRowHasFocus; ++c) {
            QModelIndex idx = d->model->index(r, c, parent);
            currentRowHasFocus = (idx == current);
        }
        QModelIndex parent = d->model->parent(index);
        for (int c = right; c < header->count() && !currentRowHasFocus; ++c) {
            currentRowHasFocus = (d->model->index(r, c, parent) == current);
        }
    }

    // ### special case: if we select entire rows, then we need to draw the
    // selection in the first column all the way to the second column, rather
    // than just around the item text. We abuse showDecorationSelected to
    // indicate this to the style. Below we will reset this value temporarily
    // to only respect the styleHint while we are rendering the decoration.
    opt.showDecorationSelected = (d->selectionBehavior & SelectRows)
                                 || option.showDecorationSelected;

    int width, height = option.rect.height();
    int position;
    QModelIndex modelIndex;
    const bool hoverRow = selectionBehavior() == QAbstractItemView::SelectRows
                  && index.parent() == hover.parent()
                  && index.row() == hover.row();

    QList<int> logicalIndices;
    QList<QStyleOptionViewItem::ViewItemPosition>
            viewItemPosList; // vector of left/middle/end for each logicalIndex
    d->calcLogicalIndices(&logicalIndices, &viewItemPosList, left, right);

    for (int currentLogicalSection = 0; currentLogicalSection < logicalIndices.size(); ++currentLogicalSection) {
        int headerSection = logicalIndices.at(currentLogicalSection);
        position = columnViewportPosition(headerSection) + offset.x();
        width = header->sectionSize(headerSection);

        if (spanning) {
            int lastSection = header->logicalIndex(header->count() - 1);
            if (!reverse) {
                width = columnViewportPosition(lastSection) + header->sectionSize(lastSection) - position;
            } else {
                width += position - columnViewportPosition(lastSection);
                position = columnViewportPosition(lastSection);
            }
        }

        modelIndex = d->model->index(index.row(), headerSection, parent);
        if (!modelIndex.isValid())
            continue;
        opt.state = state;

        opt.viewItemPosition = viewItemPosList.at(currentLogicalSection);

        // fake activeness when row editor has focus
        if (indexWidgetHasFocus)
            opt.state |= QStyle::State_Active;

        if (d->selectionModel->isSelected(modelIndex))
            opt.state |= QStyle::State_Selected;
        if (widgetHasFocus && (current == modelIndex)) {
            if (allColumnsShowFocus)
                currentRowHasFocus = true;
            else
                opt.state |= QStyle::State_HasFocus;
        }
        opt.state.setFlag(QStyle::State_MouseOver,
                          (hoverRow || modelIndex == hover)
                          && (option.showDecorationSelected || d->hoverBranch == -1));

        if (enabled) {
            QPalette::ColorGroup cg;
            if ((d->model->flags(modelIndex) & Qt::ItemIsEnabled) == 0) {
                opt.state &= ~QStyle::State_Enabled;
                cg = QPalette::Disabled;
            } else if (opt.state & QStyle::State_Active) {
                cg = QPalette::Active;
            } else {
                cg = QPalette::Inactive;
            }
            opt.palette.setCurrentColorGroup(cg);
        }

        if (alternate) {
            opt.features.setFlag(QStyleOptionViewItem::Alternate, d->current & 1);
        }
        opt.features &= ~QStyleOptionViewItem::IsDecoratedRootColumn;

        /* Prior to Qt 4.3, the background of the branch (in selected state and
           alternate row color was provided by the view. For backward compatibility,
           this is now delegated to the style using PE_PanelItemViewRow which
           does the appropriate fill */
        if (d->isTreePosition(headerSection)) {
            const int i = d->indentationForItem(d->current);
            QRect branches(reverse ? position + width - i : position, y, i, height);
            const bool setClipRect = branches.width() > width;
            if (setClipRect) {
                painter->save();
                painter->setClipRect(QRect(position, y, width, height));
            }
            // draw background for the branch (selection + alternate row)

            // We use showDecorationSelected both to store the style hint, and to indicate
            // that the entire row has to be selected (see overrides of the value if
            // selectionBehavior == SelectRow).
            // While we are only painting the background we don't care for the
            // selectionBehavior factor, so respect only the style value, and reset later.
            const bool oldShowDecorationSelected = opt.showDecorationSelected;
            opt.showDecorationSelected = style()->styleHint(QStyle::SH_ItemView_ShowDecorationSelected,
                                                            &opt, this);
            opt.rect = branches;
            if (opt.rect.width() > 0) {
                // the root item also has a branch decoration
                opt.features |= QStyleOptionViewItem::IsDecoratedRootColumn;
                // we now want to draw the branch decoration
                opt.features |= QStyleOptionViewItem::IsDecorationForRootColumn;
                style()->drawPrimitive(QStyle::PE_PanelItemViewRow, &opt, painter, this);
                opt.features &= ~QStyleOptionViewItem::IsDecorationForRootColumn;
            }

            // draw background of the item (only alternate row). rest of the background
            // is provided by the delegate
            QStyle::State oldState = opt.state;
            opt.state &= ~QStyle::State_Selected;
            opt.rect.setRect(reverse ? position : i + position, y, width - i, height);
            style()->drawPrimitive(QStyle::PE_PanelItemViewRow, &opt, painter, this);
            opt.state = oldState;
            opt.showDecorationSelected = oldShowDecorationSelected;

            if (d->indent != 0)
                drawBranches(painter, branches, index);
            if (setClipRect)
                painter->restore();
        } else {
            QStyle::State oldState = opt.state;
            opt.state &= ~QStyle::State_Selected;
            opt.rect.setRect(position, y, width, height);
            style()->drawPrimitive(QStyle::PE_PanelItemViewRow, &opt, painter, this);
            opt.state = oldState;
        }

        itemDelegateForIndex(modelIndex)->paint(painter, opt, modelIndex);
    }

    if (currentRowHasFocus) {
        QStyleOptionFocusRect o;
        o.QStyleOption::operator=(option);
        o.state |= QStyle::State_KeyboardFocusChange;
        QPalette::ColorGroup cg = (option.state & QStyle::State_Enabled)
                                  ? QPalette::Normal : QPalette::Disabled;
        o.backgroundColor = option.palette.color(cg, d->selectionModel->isSelected(index)
                                                 ? QPalette::Highlight : QPalette::Window);
        int x = 0;
        if (!option.showDecorationSelected)
            x = header->sectionPosition(0) + d->indentationForItem(d->current);
        QRect focusRect(x - header->offset(), y, header->length() - x, height);
        o.rect = style()->visualRect(layoutDirection(), d->viewport->rect(), focusRect);
        style()->drawPrimitive(QStyle::PE_FrameFocusRect, &o, painter);
        // if we show focus on all columns and the first section is moved,
        // we have to split the focus rect into two rects
        if (allColumnsShowFocus && !option.showDecorationSelected
            && header->sectionsMoved() && (header->visualIndex(0) != 0)) {
            QRect sectionRect(0, y, header->sectionPosition(0), height);
            o.rect = style()->visualRect(layoutDirection(), d->viewport->rect(), sectionRect);
            style()->drawPrimitive(QStyle::PE_FrameFocusRect, &o, painter);
        }
    }
}